

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdFindVarNum(char *pDsd)

{
  int iVar1;
  byte bVar2;
  char *pcVar4;
  char cVar3;
  
  cVar3 = *pDsd;
  if (cVar3 != '\0') {
    pcVar4 = pDsd + 1;
    iVar1 = 0;
    do {
      bVar2 = cVar3 + 0x9f;
      if (bVar2 < 0x1a) {
        if (iVar1 <= (char)bVar2) {
          iVar1 = (int)(char)bVar2;
        }
      }
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
    return iVar1 + 1;
  }
  return 1;
}

Assistant:

int Dau_DsdFindVarNum( char * pDsd )
{
    int vMax = 0;
    pDsd--;
    while ( *++pDsd )
        if ( *pDsd >= 'a' && *pDsd <= 'z' )
            vMax = Abc_MaxInt( vMax, *pDsd - 'a' );
    return vMax + 1;
}